

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * get_enclosing(gravity_parser_t *parser,gnode_n tag)

{
  gravity_parser_t *local_38;
  int local_30;
  gnode_t *decl;
  int32_t n;
  gnode_n tag_local;
  gravity_parser_t *parser_local;
  
  if (parser->declarations == (gnode_r *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = (int)parser->declarations->n;
  }
  if (local_30 == 0) {
    parser_local = (gravity_parser_t *)0x0;
  }
  else {
    do {
      decl._0_4_ = local_30 + -1;
      if ((int)decl < 0) {
        return (gnode_t *)0x0;
      }
      if (((int)decl < 0) || (parser->declarations->n <= (ulong)(long)(int)decl)) {
        local_38 = (gravity_parser_t *)0x0;
      }
      else {
        local_38 = (gravity_parser_t *)parser->declarations->p[(int)decl];
      }
      if (local_38 == (gravity_parser_t *)0x0) {
        return (gnode_t *)0x0;
      }
      local_30 = (int)decl;
    } while (*(gnode_n *)&local_38->lexer != tag);
    parser_local = local_38;
  }
  return (gnode_t *)parser_local;
}

Assistant:

static gnode_t *get_enclosing (gravity_parser_t *parser, gnode_n tag) {
    int32_t n = (int32_t)gnode_array_size(parser->declarations);
    if (!n) return NULL;

    --n;
    while (n >= 0) {
        gnode_t *decl = gnode_array_get(parser->declarations, n);
        if (!decl) return NULL;
        if (decl->tag == tag) return decl;
        --n;
    }

    return NULL;
}